

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qset.h
# Opt level: O2

QSet<QPersistentModelIndex> * __thiscall
QSet<QPersistentModelIndex>::subtract
          (QSet<QPersistentModelIndex> *this,QSet<QPersistentModelIndex> *other)

{
  Span *pSVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  piter local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->q_hash).d == (other->q_hash).d) {
    QHash<QPersistentModelIndex,_QHashDummyValue>::clear(&this->q_hash);
  }
  else {
    local_28 = (piter)QHash<QPersistentModelIndex,_QHashDummyValue>::begin(&other->q_hash);
    while( true ) {
      if (local_28.d == (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0 &&
          local_28.bucket == 0) break;
      pSVar1 = (local_28.d)->spans;
      uVar2 = local_28.bucket >> 7;
      QHash<QPersistentModelIndex,_QHashDummyValue>::removeImpl<QPersistentModelIndex>
                (&this->q_hash,
                 (QPersistentModelIndex *)
                 (pSVar1[uVar2].entries + pSVar1[uVar2].offsets[(uint)local_28.bucket & 0x7f]));
      QHashPrivate::iterator<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
      operator++(&local_28);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

Q_INLINE_TEMPLATE QSet<T> &QSet<T>::subtract(const QSet<T> &other)
{
    if (q_hash.isSharedWith(other.q_hash)) {
        clear();
    } else {
        for (const auto &e : other)
            remove(e);
    }
    return *this;
}